

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O1

void __thiscall TPZStream::Write(TPZStream *this,longdouble *p,int howMany)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < howMany) {
    uVar3 = (long)howMany * 8;
  }
  pvVar1 = operator_new__(uVar3);
  if (howMany != 0) {
    lVar2 = 0;
    do {
      *(double *)((long)pvVar1 + lVar2) = (double)*(longdouble *)((long)p + lVar2 * 2);
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)howMany << 3 != lVar2);
  }
  (*this->_vptr_TPZStream[8])(this,pvVar1,(ulong)(uint)howMany);
  operator_delete__(pvVar1);
  return;
}

Assistant:

void TPZStream::Write(const long double *p, int howMany) {//weird but necessary for working between different OSs
    double *copy = new double[howMany];
    for (unsigned int i = 0; i < howMany; ++i) {
        copy[i] = (double) p[i];
    }
    Write(copy, howMany);
    delete[] copy;
}